

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O0

void basist::prepare_atc_single_color_table(atc_match_entry *pTable,int size0,int size1,int sel)

{
  uint uVar1;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int e;
  int hi_e;
  int hi;
  int lo_e;
  int lo;
  int lowest_e;
  int i;
  int local_30;
  uint local_2c;
  int local_28;
  uint local_24;
  int local_20;
  int local_1c;
  int local_18;
  
  local_18 = 0;
  do {
    if (0xff < local_18) {
      return;
    }
    local_1c = 0x100;
    for (local_20 = 0; local_20 < in_ESI; local_20 = local_20 + 1) {
      if (in_ESI == 0x10) {
        uVar1 = local_20 << 1 | local_20 >> 3;
        local_24 = uVar1 << 3 | (int)uVar1 >> 2;
      }
      else if (in_ESI == 0x20) {
        local_24 = local_20 << 3 | local_20 >> 2;
      }
      else {
        local_24 = local_20 << 2 | local_20 >> 4;
      }
      for (local_28 = 0; local_28 < in_EDX; local_28 = local_28 + 1) {
        if (in_EDX == 0x10) {
          uVar1 = local_28 << 1 | local_28 >> 3;
          local_2c = uVar1 << 3 | (int)uVar1 >> 2;
        }
        else if (in_EDX == 0x20) {
          local_2c = local_28 << 3 | local_28 >> 2;
        }
        else {
          local_2c = local_28 << 2 | local_28 >> 4;
        }
        if (in_ECX == 1) {
          local_30 = (int)(local_24 * 5 + local_2c * 3) / 8 - local_18;
          if (local_30 < 1) {
            local_30 = -local_30;
          }
        }
        else {
          if (in_ECX != 3) {
            __assert_fail("sel == 3",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                          ,0x17af,
                          "void basist::prepare_atc_single_color_table(atc_match_entry *, int, int, int)"
                         );
          }
          local_30 = local_2c - local_18;
          if (local_30 < 1) {
            local_30 = -local_30;
          }
        }
        if (local_30 < local_1c) {
          *(char *)(in_RDI + (long)local_18 * 2) = (char)local_20;
          *(char *)(in_RDI + 1 + (long)local_18 * 2) = (char)local_28;
          local_1c = local_30;
        }
      }
    }
    local_18 = local_18 + 1;
  } while( true );
}

Assistant:

static void prepare_atc_single_color_table(atc_match_entry* pTable, int size0, int size1, int sel)
	{
		for (int i = 0; i < 256; i++)
		{
			int lowest_e = 256;
			for (int lo = 0; lo < size0; lo++)
			{
				int lo_e = lo;
				if (size0 == 16)
				{
					lo_e = (lo_e << 1) | (lo_e >> 3);
					lo_e = (lo_e << 3) | (lo_e >> 2);
				}
				else if (size0 == 32)
					lo_e = (lo_e << 3) | (lo_e >> 2);
				else
					lo_e = (lo_e << 2) | (lo_e >> 4);

				for (int hi = 0; hi < size1; hi++)
				{
					int hi_e = hi;
					if (size1 == 16)
					{
						// This is only for PVRTC2 - expand to 5 then 8
						hi_e = (hi_e << 1) | (hi_e >> 3);
						hi_e = (hi_e << 3) | (hi_e >> 2);
					}
					else if (size1 == 32)
						hi_e = (hi_e << 3) | (hi_e >> 2);
					else
						hi_e = (hi_e << 2) | (hi_e >> 4);

					int e;

					if (sel == 1)
					{
						// Selector 1
						e = abs(((lo_e * 5 + hi_e * 3) / 8) - i);
					}
					else
					{
						assert(sel == 3);

						// Selector 3
						e = abs(hi_e - i);
					}

					if (e < lowest_e)
					{
						pTable[i].m_lo = static_cast<uint8_t>(lo);
						pTable[i].m_hi = static_cast<uint8_t>(hi);

						lowest_e = e;
					}

				} // hi
			} // lo
		} // i
	}